

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O0

bool __thiscall trun::TestRunner::ExecuteMain(TestRunner *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  kTestResult kVar2;
  Config *pCVar3;
  element_type *dynlib;
  ResultSummary *this_01;
  element_type *peVar4;
  shared_ptr<trun::TestFunc> local_b8;
  undefined8 local_a8;
  CBPrePostHook local_a0;
  CBPrePostHook local_98 [2];
  undefined1 local_88 [8];
  Ref result;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  Ref dummy;
  bool bRes;
  TestRunner *this_local;
  
  dummy.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1
  ;
  pCVar3 = Config::Instance();
  if ((pCVar3->testGlobalMain & 1U) == 0) {
    return (bool)(dummy.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi._7_1_ & 1);
  }
  bVar1 = std::operator==(&this->globalMain,(nullptr_t)0x0);
  if (bVar1) {
    return (bool)(dummy.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi._7_1_ & 1);
  }
  (*this->pLogger->_vptr_ILogger[6])(this->pLogger,"Executing Global Main");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"_dummy-main_",&local_51);
  TestModule::Create((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  this_00 = &result.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<trun::TestModule>::shared_ptr
            ((shared_ptr<trun::TestModule> *)this_00,(shared_ptr<trun::TestModule> *)local_30);
  SetCurrentTestModule((Ref *)this_00);
  std::shared_ptr<trun::TestModule>::~shared_ptr((shared_ptr<trun::TestModule> *)this_00);
  dynlib = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->globalMain);
  std::shared_ptr<trun::IDynLibrary>::shared_ptr
            ((shared_ptr<trun::IDynLibrary> *)local_98,&this->library);
  local_a0.cbHookV1 = (TRUN_PRE_POST_HOOK_DELEGATE_V1 *)0x0;
  local_a8 = 0;
  TestFunc::Execute((TestFunc *)local_88,(Ref *)dynlib,local_98,&local_a0);
  std::shared_ptr<trun::IDynLibrary>::~shared_ptr((shared_ptr<trun::IDynLibrary> *)local_98);
  this_01 = ResultSummary::Instance();
  std::shared_ptr<trun::TestFunc>::shared_ptr(&local_b8,&this->globalMain);
  ResultSummary::AddResult(this_01,&local_b8);
  std::shared_ptr<trun::TestFunc>::~shared_ptr(&local_b8);
  peVar4 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_88);
  kVar2 = TestResult::Result(peVar4);
  if (kVar2 != kTestResult_AllFail) {
    peVar4 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
    kVar2 = TestResult::Result(peVar4);
    if (kVar2 != kTestResult_TestFail) goto LAB_001192ba;
  }
  pCVar3 = Config::Instance();
  if ((pCVar3->stopOnAllFail & 1U) != 0) {
    (*this->pLogger->_vptr_ILogger[6])(this->pLogger,"Total test failure, aborting");
    dummy.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
         0;
  }
LAB_001192ba:
  (*this->pLogger->_vptr_ILogger[6])(this->pLogger,"Done: test main\n\n");
  bVar1 = (bool)(dummy.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._7_1_ & 1);
  std::shared_ptr<trun::TestResult>::~shared_ptr((shared_ptr<trun::TestResult> *)local_88);
  std::shared_ptr<trun::TestModule>::~shared_ptr((shared_ptr<trun::TestModule> *)local_30);
  return bVar1;
}

Assistant:

bool TestRunner::ExecuteMain() {
    // 1) call test_main which is used to initalized anything shared between tests
    bool bRes = true;
    if (!Config::Instance().testGlobalMain) {
        return bRes;
    }
    if (globalMain == nullptr) {
        return bRes;
    }

    pLogger->Info("Executing Global Main");

    //
    // Create a dummy test-module here, this is because we treat everything as a test-case and all other cases
    // belong to a module - so we make that assumption. A module CAN NOT start with '_'...
    //
    auto dummy = TestModule::Create("_dummy-main_");
    SetCurrentTestModule(dummy);
    TestResult::Ref result = globalMain->Execute(library, {}, {});
    ResultSummary::Instance().AddResult(globalMain);
    if ((result->Result() == kTestResult_AllFail) || (result->Result() == kTestResult_TestFail)) {
        if (Config::Instance().stopOnAllFail) {
            pLogger->Info("Total test failure, aborting");
            bRes = false;
        }
    }

    pLogger->Info("Done: test main\n\n");
    return bRes;
}